

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

int lgx_type_cmp_function(lgx_type_function_t *t1,lgx_type_function_t *t2)

{
  lgx_val_type_t lVar1;
  int iVar2;
  ulong uVar3;
  lgx_type_t *t2_00;
  lgx_type_t *t1_00;
  
  if ((t1->receiver).type == T_UNKNOWN) {
    lVar1 = (t2->receiver).type;
  }
  else {
    lVar1 = lgx_type_cmp(&t1->receiver,&t2->receiver);
  }
  iVar2 = 1;
  if (lVar1 == T_UNKNOWN) {
    iVar2 = 1;
    if ((t1->ret).type == T_UNKNOWN) {
      lVar1 = (t2->ret).type;
    }
    else {
      lVar1 = lgx_type_cmp(&t1->ret,&t2->ret);
    }
    if ((lVar1 == T_UNKNOWN) && (uVar3 = (ulong)t1->arg_len, t1->arg_len == t2->arg_len)) {
      if (uVar3 != 0) {
        t1_00 = t1->args;
        t2_00 = t2->args;
        do {
          iVar2 = lgx_type_cmp(t1_00,t2_00);
          if (iVar2 != 0) {
            return 1;
          }
          t2_00 = t2_00 + 1;
          t1_00 = t1_00 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int lgx_type_cmp_function(lgx_type_function_t* t1, lgx_type_function_t* t2) {
    if (t1->receiver.type == T_UNKNOWN) {
        if (t2->receiver.type != T_UNKNOWN) {
            return 1;
        }
    } else {
        if (lgx_type_cmp(&t1->receiver, &t2->receiver)) {
            return 1;
        }
    }

    if (t1->ret.type == T_UNKNOWN) {
        if (t2->ret.type != T_UNKNOWN) {
            return 1;
        }
    } else {
        if (lgx_type_cmp(&t1->ret, &t2->ret)) {
            return 1;
        }
    }

    if (t1->arg_len != t2->arg_len) {
        return 1;
    }

    int i;
    for (i = 0; i < t1->arg_len; ++i) {
        if (lgx_type_cmp(&t1->args[i], &t2->args[i])) {
            return 1;
        }
    }

    return 0;
}